

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall xLearn::Reader::SetBlockSize(Reader *this,size_t size)

{
  ostream *poVar1;
  Logger local_5c;
  string local_58;
  string local_38;
  
  if (size != 0) {
    this->block_size_ = size;
    return;
  }
  local_5c.severity_ = ERR;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader.h"
             ,"");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"SetBlockSize","");
  poVar1 = Logger::Start(ERR,&local_38,0x6c,&local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK_GT failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader.h"
             ,0x56);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x6c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"size",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"0",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  Logger::~Logger(&local_5c);
  abort();
}

Assistant:

inline void SetBlockSize(size_t size) { 
    CHECK_GT(size, 0);
    block_size_ = size; 
  }